

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_drag(nk_text_edit *state,float x,float y,nk_user_font *font,float row_height)

{
  int iVar1;
  long in_RDI;
  float unaff_retaddr;
  int p;
  
  iVar1 = nk_textedit_locate_coord
                    ((nk_text_edit *)CONCAT44(x,y),font._4_4_,font._0_4_,
                     (nk_user_font *)CONCAT44(row_height,p),unaff_retaddr);
  if (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0xb0)) {
    *(undefined4 *)(in_RDI + 0xac) = *(undefined4 *)(in_RDI + 0xa8);
  }
  *(int *)(in_RDI + 0xb0) = iVar1;
  *(int *)(in_RDI + 0xa8) = iVar1;
  return;
}

Assistant:

NK_LIB void
nk_textedit_drag(struct nk_text_edit *state, float x, float y,
const struct nk_user_font *font, float row_height)
{
/* API drag: on mouse drag, move the cursor and selection endpoint
     * to the clicked location */
int p = nk_textedit_locate_coord(state, x, y, font, row_height);
if (state->select_start == state->select_end)
state->select_start = state->cursor;
state->cursor = state->select_end = p;
}